

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological_sort.h
# Opt level: O2

void __thiscall
wasm::TopologicalSort<wasm::HeapType,_SubTypesFirstSort>::push
          (TopologicalSort<wasm::HeapType,_SubTypesFirstSort> *this,HeapType item)

{
  size_type sVar1;
  key_type local_18;
  HeapType item_local;
  
  local_18.id = item.id;
  sVar1 = std::
          _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&(this->finished)._M_h,&local_18);
  if (sVar1 == 0) {
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
              (&this->workStack,&local_18);
  }
  return;
}

Assistant:

void push(T item) {
    if (finished.count(item)) {
      return;
    }
    workStack.push_back(item);
  }